

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrcase.cpp
# Opt level: O0

int32_t icu_63::anon_unknown_10::appendResult
                  (UChar *dest,int32_t destIndex,int32_t destCapacity,int32_t result,UChar *s,
                  int32_t cpLength,uint32_t options,Edits *edits)

{
  bool bVar1;
  int32_t local_3c;
  uint uStack_38;
  UBool isError;
  int32_t length;
  UChar32 c;
  int32_t cpLength_local;
  UChar *s_local;
  int32_t result_local;
  int32_t destCapacity_local;
  int32_t destIndex_local;
  UChar *dest_local;
  
  if (result < 0) {
    if (edits != (Edits *)0x0) {
      Edits::addUnchanged(edits,cpLength);
    }
    if ((options & 0x4000) != 0) {
      return destIndex;
    }
    uStack_38 = result ^ 0xffffffff;
    local_3c = cpLength;
    if ((destIndex < destCapacity) && ((int)uStack_38 < 0x10000)) {
      dest[destIndex] = (UChar)uStack_38;
      return destIndex + 1;
    }
  }
  else {
    if (result < 0x20) {
      uStack_38 = 0xffffffff;
      local_3c = result;
    }
    else {
      if ((destIndex < destCapacity) && (result < 0x10000)) {
        dest[destIndex] = (UChar)result;
        if (edits == (Edits *)0x0) {
          return destIndex + 1;
        }
        Edits::addReplace(edits,cpLength,1);
        return destIndex + 1;
      }
      local_3c = 2;
      uStack_38 = result;
      if ((uint)result < 0x10000) {
        local_3c = 1;
      }
    }
    if (edits != (Edits *)0x0) {
      Edits::addReplace(edits,cpLength,local_3c);
    }
  }
  if (0x7fffffff - destIndex < local_3c) {
    dest_local._4_4_ = -1;
  }
  else {
    if (destIndex < destCapacity) {
      result_local = destIndex;
      if ((int)uStack_38 < 0) {
        _c = s;
        if (destCapacity < destIndex + local_3c) {
          result_local = local_3c + destIndex;
        }
        else {
          for (; 0 < local_3c; local_3c = local_3c + -1) {
            dest[result_local] = *_c;
            _c = _c + 1;
            result_local = result_local + 1;
          }
        }
      }
      else {
        bVar1 = false;
        if (uStack_38 < 0x10000) {
          result_local = destIndex + 1;
          dest[destIndex] = (UChar)uStack_38;
        }
        else if ((uStack_38 < 0x110000) && (destIndex + 1 < destCapacity)) {
          dest[destIndex] = (short)((int)uStack_38 >> 10) + L'ퟀ';
          result_local = destIndex + 2;
          dest[destIndex + 1] = (UChar)uStack_38 & 0x3ffU | 0xdc00;
        }
        else {
          bVar1 = true;
        }
        if (bVar1) {
          result_local = local_3c + result_local;
        }
      }
    }
    else {
      result_local = local_3c + destIndex;
    }
    dest_local._4_4_ = result_local;
  }
  return dest_local._4_4_;
}

Assistant:

inline int32_t
appendResult(UChar *dest, int32_t destIndex, int32_t destCapacity,
             int32_t result, const UChar *s,
             int32_t cpLength, uint32_t options, icu::Edits *edits) {
    UChar32 c;
    int32_t length;

    /* decode the result */
    if(result<0) {
        /* (not) original code point */
        if(edits!=NULL) {
            edits->addUnchanged(cpLength);
        }
        if(options & U_OMIT_UNCHANGED_TEXT) {
            return destIndex;
        }
        c=~result;
        if(destIndex<destCapacity && c<=0xffff) {  // BMP slightly-fastpath
            dest[destIndex++]=(UChar)c;
            return destIndex;
        }
        length=cpLength;
    } else {
        if(result<=UCASE_MAX_STRING_LENGTH) {
            c=U_SENTINEL;
            length=result;
        } else if(destIndex<destCapacity && result<=0xffff) {  // BMP slightly-fastpath
            dest[destIndex++]=(UChar)result;
            if(edits!=NULL) {
                edits->addReplace(cpLength, 1);
            }
            return destIndex;
        } else {
            c=result;
            length=U16_LENGTH(c);
        }
        if(edits!=NULL) {
            edits->addReplace(cpLength, length);
        }
    }
    if(length>(INT32_MAX-destIndex)) {
        return -1;  // integer overflow
    }

    if(destIndex<destCapacity) {
        /* append the result */
        if(c>=0) {
            /* code point */
            UBool isError=FALSE;
            U16_APPEND(dest, destIndex, destCapacity, c, isError);
            if(isError) {
                /* overflow, nothing written */
                destIndex+=length;
            }
        } else {
            /* string */
            if((destIndex+length)<=destCapacity) {
                while(length>0) {
                    dest[destIndex++]=*s++;
                    --length;
                }
            } else {
                /* overflow */
                destIndex+=length;
            }
        }
    } else {
        /* preflight */
        destIndex+=length;
    }
    return destIndex;
}